

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O3

uint32_t __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  uint32_t uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  
  if (len != 0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    uVar9 = (ulong)len + 0x3fffffffffffffff;
    auVar18 = vpbroadcastq_avx512f();
    lVar10 = 0;
    do {
      auVar19 = vpbroadcastq_avx512f();
      auVar20 = vmovdqa64_avx512f(auVar23);
      auVar23 = vporq_avx512f(auVar19,auVar16);
      auVar19 = vporq_avx512f(auVar19,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar19,auVar18,2);
      bVar7 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar23,auVar18,2);
      bVar8 = (byte)uVar5;
      uVar14 = CONCAT11(bVar8,bVar7);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + lVar10));
      auVar19._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar23._4_4_;
      auVar19._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar23._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar23._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar23._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar23._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar23._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar23._28_4_;
      auVar19._32_4_ = (uint)(bVar8 & 1) * auVar23._32_4_;
      auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar23._36_4_;
      auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar23._40_4_;
      auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar23._44_4_;
      auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar23._48_4_;
      auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar23._52_4_;
      auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar23._56_4_;
      auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar23._60_4_;
      lVar10 = lVar10 + 0x10;
      auVar23 = vpord_avx512f(auVar19,auVar20);
    } while (((uVar9 & 0x3fffffffffffffff) + 0x10) - (ulong)((uint)uVar9 & 0xf) != lVar10);
    auVar16 = vmovdqa32_avx512f(auVar23);
    auVar17._0_4_ = (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
    bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar2 * auVar16._4_4_ | (uint)!bVar2 * auVar20._4_4_;
    bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar2 * auVar16._8_4_ | (uint)!bVar2 * auVar20._8_4_;
    bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar2 * auVar16._12_4_ | (uint)!bVar2 * auVar20._12_4_;
    bVar2 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar2 * auVar16._16_4_ | (uint)!bVar2 * auVar20._16_4_;
    bVar2 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar2 * auVar16._20_4_ | (uint)!bVar2 * auVar20._20_4_;
    bVar2 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar2 * auVar16._24_4_ | (uint)!bVar2 * auVar20._24_4_;
    bVar2 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar2 * auVar16._28_4_ | (uint)!bVar2 * auVar20._28_4_;
    auVar17._32_4_ = (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
    bVar2 = (bool)(bVar8 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar2 * auVar16._36_4_ | (uint)!bVar2 * auVar20._36_4_;
    bVar2 = (bool)(bVar8 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar2 * auVar16._40_4_ | (uint)!bVar2 * auVar20._40_4_;
    bVar2 = (bool)(bVar8 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar2 * auVar16._44_4_ | (uint)!bVar2 * auVar20._44_4_;
    bVar2 = (bool)(bVar8 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar2 * auVar16._48_4_ | (uint)!bVar2 * auVar20._48_4_;
    bVar2 = (bool)(bVar8 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar2 * auVar16._52_4_ | (uint)!bVar2 * auVar20._52_4_;
    bVar2 = (bool)(bVar8 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar2 * auVar16._56_4_ | (uint)!bVar2 * auVar20._56_4_;
    auVar17._60_4_ =
         (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar17,1);
    auVar16 = vpord_avx512f(auVar17,ZEXT3264(auVar15));
    auVar3 = vpor_avx(auVar16._0_16_,auVar16._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpor_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpor_avx(auVar3,auVar4);
    if (auVar3._0_4_ != 0) {
      uVar11 = 0x20 - LZCOUNT(auVar3._0_4_);
      goto LAB_001232dd;
    }
  }
  uVar11 = 0;
LAB_001232dd:
  uVar9 = 0xffffffff;
  do {
    uVar9 = (ulong)((int)uVar9 + 1);
  } while (*(int *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar9 * 4) + 0x1cU < uVar11
          );
  uVar12 = (DAT_001c03c8 - NewPFor<4u,FastPForLib::Simple16<false>>::possLogs >> 2) - 1;
  if (uVar9 < uVar12) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f();
    do {
      uVar1 = *(uint32_t *)(NewPFor<4u,FastPForLib::Simple16<false>>::possLogs + uVar9 * 4);
      if (len == 0) {
        return uVar1;
      }
      if (uVar1 == 0x20) {
        return 0x20;
      }
      auVar23 = vpbroadcastq_avx512f();
      auVar19 = ZEXT1664((undefined1  [16])0x0);
      uVar13 = 0;
      do {
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vmovdqa64_avx512f(auVar19);
        auVar19 = vporq_avx512f(auVar20,auVar16);
        auVar20 = vporq_avx512f(auVar20,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar20,auVar18,2);
        bVar7 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar18,2);
        bVar8 = (byte)uVar5;
        uVar14 = CONCAT11(bVar8,bVar7);
        auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in + uVar13));
        auVar15._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
        auVar15._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
        auVar15._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
        auVar15._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
        auVar15._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
        auVar15._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
        auVar15._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
        auVar15._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
        auVar20._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
        auVar20._0_32_ = auVar15;
        auVar20._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
        auVar20._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
        auVar20._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
        auVar20._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
        auVar20._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
        auVar20._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
        auVar20._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
        uVar13 = uVar13 + 0x10;
        auVar19 = vpmovzxdq_avx512f(auVar15);
        auVar15 = vextracti64x4_avx512f(auVar20,1);
        auVar20 = vpmovzxdq_avx512f(auVar15);
        auVar19 = vpsrlvq_avx512f(auVar19,auVar23);
        auVar20 = vpsrlvq_avx512f(auVar20,auVar23);
        uVar5 = vptestmq_avx512f(auVar19,auVar19);
        uVar6 = vptestmq_avx512f(auVar20,auVar20);
        auVar19 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar6,(char)uVar5));
        auVar19 = vpsubd_avx512f(auVar21,auVar19);
      } while (((ulong)len + 0xf & 0xfffffffffffffff0) != uVar13);
      auVar23 = vmovdqa32_avx512f(auVar19);
      auVar22._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._0_4_;
      bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar2 * auVar23._4_4_ | (uint)!bVar2 * auVar21._4_4_;
      bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar2 * auVar23._8_4_ | (uint)!bVar2 * auVar21._8_4_;
      bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar2 * auVar23._12_4_ | (uint)!bVar2 * auVar21._12_4_;
      bVar2 = (bool)((byte)(uVar14 >> 4) & 1);
      auVar22._16_4_ = (uint)bVar2 * auVar23._16_4_ | (uint)!bVar2 * auVar21._16_4_;
      bVar2 = (bool)((byte)(uVar14 >> 5) & 1);
      auVar22._20_4_ = (uint)bVar2 * auVar23._20_4_ | (uint)!bVar2 * auVar21._20_4_;
      bVar2 = (bool)((byte)(uVar14 >> 6) & 1);
      auVar22._24_4_ = (uint)bVar2 * auVar23._24_4_ | (uint)!bVar2 * auVar21._24_4_;
      bVar2 = (bool)((byte)(uVar14 >> 7) & 1);
      auVar22._28_4_ = (uint)bVar2 * auVar23._28_4_ | (uint)!bVar2 * auVar21._28_4_;
      auVar22._32_4_ =
           (uint)(bVar8 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar21._32_4_;
      bVar2 = (bool)(bVar8 >> 1 & 1);
      auVar22._36_4_ = (uint)bVar2 * auVar23._36_4_ | (uint)!bVar2 * auVar21._36_4_;
      bVar2 = (bool)(bVar8 >> 2 & 1);
      auVar22._40_4_ = (uint)bVar2 * auVar23._40_4_ | (uint)!bVar2 * auVar21._40_4_;
      bVar2 = (bool)(bVar8 >> 3 & 1);
      auVar22._44_4_ = (uint)bVar2 * auVar23._44_4_ | (uint)!bVar2 * auVar21._44_4_;
      bVar2 = (bool)(bVar8 >> 4 & 1);
      auVar22._48_4_ = (uint)bVar2 * auVar23._48_4_ | (uint)!bVar2 * auVar21._48_4_;
      bVar2 = (bool)(bVar8 >> 5 & 1);
      auVar22._52_4_ = (uint)bVar2 * auVar23._52_4_ | (uint)!bVar2 * auVar21._52_4_;
      bVar2 = (bool)(bVar8 >> 6 & 1);
      auVar22._56_4_ = (uint)bVar2 * auVar23._56_4_ | (uint)!bVar2 * auVar21._56_4_;
      auVar22._60_4_ =
           (uint)(bVar8 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar21._60_4_;
      auVar15 = vextracti64x4_avx512f(auVar22,1);
      auVar23 = vpaddd_avx512f(auVar22,ZEXT3264(auVar15));
      auVar3 = vpaddd_avx(auVar23._0_16_,auVar23._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpaddd_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpaddd_avx(auVar3,auVar4);
      if ((uint)(auVar3._0_4_ * 10) <= len) {
        return uVar1;
      }
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (uVar9 < uVar12);
  }
  return *(uint32_t *)(DAT_001c03c8 + -4);
}

Assistant:

__attribute__((pure)) uint32_t
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (mb > 28 + possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (; i < possLogs.size() - 1; i++) {

    const uint32_t nExceptions = tryB(possLogs[i], in, len);
    if (nExceptions * PFORDELTA_INVERSERATIO <= len)
      return possLogs[i];
  }
  return possLogs.back();
}